

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O3

void __thiscall
HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>::insert
          (HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrPassthroughLayerFB_T *handle,
          unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
          *info)

{
  GenValidUsageXrHandleInfo *pGVar1;
  GenValidUsageXrHandleInfo *pGVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  UniqueLock lock;
  XrPassthroughLayerFB_T *local_50;
  string local_48;
  unique_lock<std::mutex> local_28;
  
  local_50 = handle;
  if (handle == (XrPassthroughLayerFB_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::insert()","");
    reportInternalError(&local_48);
  }
  local_28._M_device = &this->dispatch_mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar3 = std::
          _Hashtable<XrPassthroughLayerFB_T_*,_std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughLayerFB_T_*>,_std::hash<XrPassthroughLayerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrPassthroughLayerFB_T_*,_std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughLayerFB_T_*>,_std::hash<XrPassthroughLayerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_50);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pmVar4 = std::__detail::
             _Map_base<XrPassthroughLayerFB_T_*,_std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughLayerFB_T_*>,_std::hash<XrPassthroughLayerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<XrPassthroughLayerFB_T_*,_std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrPassthroughLayerFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughLayerFB_T_*>,_std::hash<XrPassthroughLayerFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_50);
    pGVar1 = (info->_M_t).
             super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
             .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl;
    (info->_M_t).
    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
         (GenValidUsageXrHandleInfo *)0x0;
    pGVar2 = (pmVar4->_M_t).
             super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
             .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl;
    (pmVar4->_M_t).
    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = pGVar1;
    if (pGVar2 != (GenValidUsageXrHandleInfo *)0x0) {
      operator_delete(pGVar2,0x18);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Handle passed to HandleInfoBase::insert() already inserted","");
  reportInternalError(&local_48);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::insert(HandleType handle, std::unique_ptr<InfoType> &&info) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::insert()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned != info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() already inserted");
    }
    info_map_[handle] = std::move(info);
}